

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O2

void __thiscall
MT32Emu::LA32IntPartialPair::initPCM
          (LA32IntPartialPair *this,PairType useMaster,Bit16s *pcmWaveAddress,Bit32u pcmWaveLength,
          bool pcmWaveLooped)

{
  LA32WaveGenerator *pLVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (useMaster == MASTER) {
    pLVar1 = &this->master;
    lVar4 = 0x28;
    bVar3 = 1;
    lVar5 = 0x25;
    lVar6 = 0x24;
    lVar2 = 0x20;
    lVar7 = 0x18;
  }
  else {
    pLVar1 = &this->slave;
    bVar3 = this->ringModulated ^ 1;
    lVar4 = 0x88;
    lVar5 = 0x85;
    lVar6 = 0x84;
    lVar2 = 0x80;
    lVar7 = 0x78;
  }
  *(Bit16s **)((long)&(this->super_LA32PartialPair)._vptr_LA32PartialPair + lVar7) = pcmWaveAddress;
  *(Bit32u *)((long)&(this->super_LA32PartialPair)._vptr_LA32PartialPair + lVar2) = pcmWaveLength;
  *(bool *)((long)&(this->super_LA32PartialPair)._vptr_LA32PartialPair + lVar6) = pcmWaveLooped;
  *(byte *)((long)&(this->super_LA32PartialPair)._vptr_LA32PartialPair + lVar5) = bVar3;
  *(undefined4 *)((long)&(this->super_LA32PartialPair)._vptr_LA32PartialPair + lVar4) = 0;
  pLVar1->active = true;
  return;
}

Assistant:

void LA32IntPartialPair::initPCM(const PairType useMaster, const Bit16s *pcmWaveAddress, const Bit32u pcmWaveLength, const bool pcmWaveLooped) {
	if (useMaster == MASTER) {
		master.initPCM(pcmWaveAddress, pcmWaveLength, pcmWaveLooped, true);
	} else {
		slave.initPCM(pcmWaveAddress, pcmWaveLength, pcmWaveLooped, !ringModulated);
	}
}